

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall Parser::note(Parser *this,char *msg)

{
  undefined4 uVar1;
  long lVar2;
  Symbol *pSVar3;
  undefined4 uVar7;
  Data *pDVar4;
  char *pcVar5;
  qsizetype qVar6;
  qsizetype in_RCX;
  Data *pDVar8;
  long in_FS_OFFSET;
  QByteArrayView formatStringSuffix;
  QByteArrayView formatStringSuffix_00;
  QByteArrayView msg_00;
  QByteArrayView msg_01;
  Symbol local_40;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((msg != (char *)0x0) && (this->displayNotes != false)) {
    lVar2 = this->index;
    if (lVar2 < 1) {
      local_40.lineNum = -1;
      local_40.token = NOTOKEN;
      local_40.lex.d.d._0_4_ = 0;
      local_40.lex.d.d._4_4_ = 0;
      local_40.lex.d.ptr._0_4_ = 0;
      local_40.lex.d.ptr._4_4_ = 0;
      local_40.lex.d.size._0_4_ = 0;
      local_40.lex.d.size._4_4_ = 0;
      local_40.from._0_4_ = 0;
      local_40.from._4_4_ = 0;
      local_40.len = -1;
      formatStringSuffix.m_data = "note: %s\n";
      formatStringSuffix.m_size = 9;
      msg_00.m_data = msg;
      msg_00.m_size = in_RCX;
      printMsg(this,formatStringSuffix,msg_00,&local_40);
    }
    else {
      pSVar3 = (this->symbols).d.ptr;
      uVar1 = pSVar3[lVar2 + -1].lineNum;
      uVar7 = pSVar3[lVar2 + -1].token;
      pDVar4 = pSVar3[lVar2 + -1].lex.d.d;
      local_40.lex.d.d._0_4_ = SUB84(pDVar4,0);
      local_40.lex.d.d._4_4_ = (undefined4)((ulong)pDVar4 >> 0x20);
      pcVar5 = pSVar3[lVar2 + -1].lex.d.ptr;
      local_40.lex.d.ptr._0_4_ = SUB84(pcVar5,0);
      local_40.lex.d.ptr._4_4_ = (undefined4)((ulong)pcVar5 >> 0x20);
      qVar6 = pSVar3[lVar2 + -1].lex.d.size;
      local_40.lex.d.size._0_4_ = (undefined4)qVar6;
      local_40.lex.d.size._4_4_ = (undefined4)((ulong)qVar6 >> 0x20);
      if (pDVar4 == (Data *)0x0) {
        pDVar8 = (Data *)0x0;
      }
      else {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pDVar8 = pDVar4;
      }
      local_40.len = pSVar3[lVar2 + -1].len;
      local_40.from._0_4_ = (undefined4)pSVar3[lVar2 + -1].from;
      local_40.from._4_4_ = (undefined4)((ulong)pSVar3[lVar2 + -1].from >> 0x20);
      formatStringSuffix_00.m_data = "note: %s\n";
      formatStringSuffix_00.m_size = 9;
      msg_01.m_data = msg;
      msg_01.m_size = (qsizetype)pDVar4;
      local_40.lineNum = uVar1;
      local_40.token = uVar7;
      printMsg(this,formatStringSuffix_00,msg_01,&local_40);
      if (pDVar8 != (Data *)0x0) {
        LOCK();
        (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_40.lex.d.d._4_4_,local_40.lex.d.d._0_4_),1,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Parser::note(const char *msg) {
    if (displayNotes && msg)
        printMsg("note: %s\n", msg, index > 0 ? symbol() : Symbol{});
}